

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O0

void UI::PathTracerStartModal(shared_ptr<PathTracerThread> *path_tracer_thread)

{
  bool bVar1;
  element_type *this;
  element_type *this_00;
  element_type *peVar2;
  ImGuiStyle *pIVar3;
  char *in_RDI;
  float fVar4;
  float _x;
  float button_width;
  int bounce;
  int height;
  int width;
  shared_ptr<PathTracer> *path_tracer;
  PathTracerThread *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffb8;
  ImGuiSliderFlags in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffcc;
  uint32_t uVar5;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  ImVec2 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  ImGuiWindowFlags in_stack_ffffffffffffffec;
  bool *in_stack_fffffffffffffff0;
  
  ImGui::SetNextWindowCentering();
  bVar1 = ImGui::BeginPopupModal(in_RDI,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  if (bVar1) {
    this = std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x188a96);
    PathTracerThread::GetPathTracerViewerPtr(this);
    this_00 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x188aa6);
    PathTracerViewer::GetPathTracerPtr(this_00);
    peVar2 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )0x188abd);
    uVar5 = peVar2->m_width;
    ImGui::CalcItemWidth();
    ImGui::PushMultiItemsWidths(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    bVar1 = ImGui::DragInt((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           (int *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                           (int)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                           (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x188b1b);
      peVar2->m_width = uVar5;
      in_stack_ffffffffffffffcc = uVar5;
    }
    ImGui::PopItemWidth();
    ImGui::SameLine(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    peVar2 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )0x188b44);
    uVar5 = peVar2->m_height;
    bVar1 = ImGui::DragInt((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           (int *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                           (int)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                           (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x188b93);
      peVar2->m_height = uVar5;
    }
    ImGui::PopItemWidth();
    peVar2 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )0x188bac);
    fVar4 = (float)peVar2->m_bounce;
    bVar1 = ImGui::DragInt((char *)CONCAT44(fVar4,in_stack_ffffffffffffffe0),
                           (int *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                           (int)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                           (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x188bfb);
      peVar2->m_bounce = (uint32_t)fVar4;
      in_stack_ffffffffffffffc4 = fVar4;
    }
    fVar4 = ImGui::GetWindowContentRegionWidth();
    pIVar3 = ImGui::GetStyle();
    _x = (fVar4 - (pIVar3->ItemSpacing).x) * 0.5;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,_x,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffc4,fVar4),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x188c66);
      PathTracerThread::Launch(in_stack_00000060);
      ImGui::CloseCurrentPopup();
    }
    ImGui::SetItemDefaultFocus();
    ImGui::SameLine(in_stack_ffffffffffffffc4,fVar4);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,_x,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffc4,fVar4),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void PathTracerStartModal(const std::shared_ptr<PathTracerThread> &path_tracer_thread) {
	ImGui::SetNextWindowCentering();
	if (ImGui::BeginPopupModal(kPathTracerStartModal, nullptr,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar |
	                               ImGuiWindowFlags_NoMove)) {
		const auto &path_tracer = path_tracer_thread->GetPathTracerViewerPtr()->GetPathTracerPtr();

		int width = path_tracer->m_width;
		ImGui::PushMultiItemsWidths(2, ImGui::CalcItemWidth());
		if (ImGui::DragInt("Width", &width, 1, kMinWidth, kMaxWidth))
			path_tracer->m_width = width;
		ImGui::PopItemWidth();
		ImGui::SameLine();
		int height = path_tracer->m_height;
		if (ImGui::DragInt("Height", &height, 1, kMinHeight, kMaxHeight))
			path_tracer->m_height = height;
		ImGui::PopItemWidth();

		int bounce = path_tracer->m_bounce;
		if (ImGui::DragInt("Bounce", &bounce, 1, kMinBounce, kMaxBounce))
			path_tracer->m_bounce = bounce;

		float button_width = (ImGui::GetWindowContentRegionWidth() - ImGui::GetStyle().ItemSpacing.x) * 0.5f;

		if (ImGui::Button("Start", {button_width, 0})) {
			path_tracer_thread->Launch();

			ImGui::CloseCurrentPopup();
		}
		ImGui::SetItemDefaultFocus();
		ImGui::SameLine();
		if (ImGui::Button("Cancel", {button_width, 0}))
			ImGui::CloseCurrentPopup();

		ImGui::EndPopup();
	}
}